

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O0

rotation_t * opengv::math::cayley2rot(cayley_t *cayley)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  rotation_t *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double scale;
  rotation_t *R;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffeb8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffec0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *this;
  StorageBaseType *matrix;
  double *scalar;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x12f8c5f);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffec0,(Index)in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)(dVar3 + 1.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f8dc2);
  *pSVar2 = ((dVar3 + 1.0) - dVar4) - dVar5;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -*pdVar1;
  auVar6 = vfmadd213sd_fma(auVar12,auVar6,auVar18);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f8e69);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  scalar = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  matrix = (StorageBaseType *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = matrix;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = scalar;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pdVar1;
  auVar6 = vfmadd213sd_fma(auVar13,auVar7,auVar19);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f8ef9);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pdVar1;
  auVar6 = vfmadd213sd_fma(auVar14,auVar8,auVar20);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f8f89);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f9057);
  *pSVar2 = ((1.0 - dVar3) + dVar4) - dVar5;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -*pdVar1;
  auVar6 = vfmadd213sd_fma(auVar15,auVar9,auVar21);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f9111);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -*pdVar1;
  auVar6 = vfmadd213sd_fma(auVar16,auVar10,auVar22);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f91ca);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pdVar1;
  auVar6 = vfmadd213sd_fma(auVar17,auVar11,auVar23);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f926d);
  *pSVar2 = auVar6._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffeb8,0x12f9344);
  *pSVar2 = ((1.0 - dVar3) - dVar4) + dVar5;
  Eigen::operator*(scalar,matrix);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)this,in_stack_fffffffffffffeb8);
  return in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::cayley2rot( const cayley_t & cayley)
{
  rotation_t R;
  double scale = 1+pow(cayley[0],2)+pow(cayley[1],2)+pow(cayley[2],2);

  R(0,0) = 1+pow(cayley[0],2)-pow(cayley[1],2)-pow(cayley[2],2);
  R(0,1) = 2*(cayley[0]*cayley[1]-cayley[2]);
  R(0,2) = 2*(cayley[0]*cayley[2]+cayley[1]);
  R(1,0) = 2*(cayley[0]*cayley[1]+cayley[2]);
  R(1,1) = 1-pow(cayley[0],2)+pow(cayley[1],2)-pow(cayley[2],2);
  R(1,2) = 2*(cayley[1]*cayley[2]-cayley[0]);
  R(2,0) = 2*(cayley[0]*cayley[2]-cayley[1]);
  R(2,1) = 2*(cayley[1]*cayley[2]+cayley[0]);
  R(2,2) = 1-pow(cayley[0],2)-pow(cayley[1],2)+pow(cayley[2],2);

  R = (1/scale) * R;
  return R;
}